

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BinaryEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryEventExpressionSyntax,slang::syntax::EventExpressionSyntax&,slang::parsing::Token&,slang::syntax::EventExpressionSyntax&>
          (BumpAllocator *this,EventExpressionSyntax *args,Token *args_1,
          EventExpressionSyntax *args_2)

{
  Token operatorToken;
  BinaryEventExpressionSyntax *this_00;
  
  this_00 = (BinaryEventExpressionSyntax *)allocate(this,0x30,8);
  operatorToken.kind = args_1->kind;
  operatorToken._2_1_ = args_1->field_0x2;
  operatorToken.numFlags.raw = (args_1->numFlags).raw;
  operatorToken.rawLen = args_1->rawLen;
  operatorToken.info = args_1->info;
  slang::syntax::BinaryEventExpressionSyntax::BinaryEventExpressionSyntax
            (this_00,args,operatorToken,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }